

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::create_path(dynamic_string *fullpath)

{
  char c_00;
  bool bVar1;
  char c_01;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  byte local_3d;
  int iStack_38;
  bool valid;
  bool is_last_char;
  bool back_sep;
  bool sep;
  char c;
  int n;
  undefined1 local_20 [4];
  int l;
  dynamic_string cur_path;
  dynamic_string *fullpath_local;
  
  cur_path.m_pStr = (char *)fullpath;
  dynamic_string::dynamic_string((dynamic_string *)local_20);
  uVar3 = dynamic_string::get_len((dynamic_string *)cur_path.m_pStr);
  for (iStack_38 = 0; iStack_38 < (int)uVar3; iStack_38 = iStack_38 + 1) {
    pcVar5 = dynamic_string::get_ptr((dynamic_string *)cur_path.m_pStr);
    c_00 = pcVar5[iStack_38];
    bVar1 = is_path_separator(c_00);
    c_01 = dynamic_string::back((dynamic_string *)local_20);
    bVar2 = is_path_separator(c_01);
    bVar6 = iStack_38 == uVar3 - 1;
    if (((bVar1) && (!bVar2)) || (bVar6)) {
      if ((bVar6) && (!bVar1)) {
        dynamic_string::append_char((dynamic_string *)local_20,c_00);
      }
      bVar1 = dynamic_string::is_empty((dynamic_string *)local_20);
      local_3d = ~bVar1 & 1;
      bVar1 = dynamic_string::operator==((dynamic_string *)local_20,"/");
      if (bVar1) {
        local_3d = 0;
      }
      if ((local_3d != 0) &&
         (uVar4 = dynamic_string::get_len((dynamic_string *)local_20), uVar4 != 0)) {
        pcVar5 = dynamic_string::get_ptr((dynamic_string *)local_20);
        mkdir(pcVar5,0x1ff);
      }
    }
    dynamic_string::append_char((dynamic_string *)local_20,c_00);
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_20);
  return true;
}

Assistant:

bool file_utils::create_path(const dynamic_string& fullpath)
    {
#ifdef WIN32
        bool got_unc = false;
#endif
        dynamic_string cur_path;

        const int l = fullpath.get_len();

        int n = 0;
        while (n < l)
        {
            const char c = fullpath.get_ptr()[n];

            const bool sep = is_path_separator(c);
            const bool back_sep = is_path_separator(cur_path.back());
            const bool is_last_char = (n == (l - 1));

            if (((sep) && (!back_sep)) || (is_last_char))
            {
                if ((is_last_char) && (!sep))
                {
                    cur_path.append_char(c);
                }

                bool valid = !cur_path.is_empty();

#ifdef WIN32
                // reject obvious stuff (drives, beginning of UNC paths):
                // c:\b\cool
                // \\machine\blah
                // \cool\blah
                if ((cur_path.get_len() == 2) && (cur_path[1] == ':'))
                {
                    valid = false;
                }

                else if ((cur_path.get_len() >= 2) && (cur_path[0] == '\\') && (cur_path[1] == '\\'))
                {
                    if (!got_unc)
                    {
                        valid = false;
                    }
                    got_unc = true;
                }
                else if (cur_path == "\\")
                {
                    valid = false;
                }
#endif
                if (cur_path == "/")
                {
                    valid = false;
                }

                if ((valid) && (cur_path.get_len()))
                {
#ifdef WIN32
                    _mkdir(cur_path.get_ptr());
#else
                    mkdir(cur_path.get_ptr(), S_IRWXU | S_IRWXG | S_IRWXO);
#endif
                }
            }

            cur_path.append_char(c);

            n++;
        }

        return true;
    }